

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

ExpressionBinder * __thiscall duckdb::Binder::GetActiveBinder(Binder *this)

{
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> *this_00;
  reference pvVar1;
  
  this_00 = GetActiveBinders(this);
  pvVar1 = vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true>::back(this_00);
  return pvVar1->_M_data;
}

Assistant:

ExpressionBinder &Binder::GetActiveBinder() {
	return GetActiveBinders().back();
}